

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_soft_max_ext_back(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,float scale,float max_bias)

{
  ggml_tensor *pgVar1;
  
  pgVar1 = ggml_new_tensor_impl(ctx,a->type,4,a->ne,(ggml_tensor *)0x0,0);
  pgVar1->op = GGML_OP_SOFT_MAX_BACK;
  pgVar1->src[0] = a;
  pgVar1->src[1] = b;
  pgVar1->op_params[0] = (int32_t)scale;
  pgVar1->op_params[1] = (int32_t)max_bias;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_soft_max_ext_back(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        float                 scale,
        float                 max_bias) {
    return ggml_soft_max_ext_back_impl(ctx, a, b, scale, max_bias, false);
}